

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# character.cpp
# Opt level: O2

void __thiscall Character::Warp(Character *this,short map,uchar x,uchar y,WarpAnimation animation)

{
  World *pWVar1;
  Arena *pAVar2;
  bool bVar3;
  Map *pMVar4;
  mapped_type *this_00;
  undefined7 in_register_00000009;
  uchar byte;
  undefined6 in_register_00000032;
  int num;
  uint num_00;
  allocator<char> local_95;
  uint local_94;
  PacketBuilder builder;
  PacketBuilder builder_1;
  
  local_94 = (uint)CONCAT71(in_register_00000009,y);
  if (map < 1) {
    return;
  }
  pWVar1 = this->world;
  num = (int)CONCAT62(in_register_00000032,map);
  if ((int)((ulong)((long)(pWVar1->maps).super__Vector_base<Map_*,_std::allocator<Map_*>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                   (long)(pWVar1->maps).super__Vector_base<Map_*,_std::allocator<Map_*>_>._M_impl.
                         super__Vector_impl_data._M_start) >> 3) < num) {
    return;
  }
  pMVar4 = World::GetMap(pWVar1,map);
  if (pMVar4->exists != true) {
    return;
  }
  PacketBuilder::PacketBuilder(&builder,PACKET_WARP,PACKET_REQUEST,0);
  if ((this->mapid == map) && (this->nowhere == false)) {
    PacketBuilder::ReserveMore(&builder,5);
    PacketBuilder::AddChar(&builder,1);
    PacketBuilder::AddShort(&builder,num);
    PacketBuilder::AddChar(&builder,(uint)x);
    num_00 = local_94 & 0xff;
    goto LAB_00111939;
  }
  PacketBuilder::ReserveMore(&builder,0xe);
  PacketBuilder::AddChar(&builder,2);
  PacketBuilder::AddShort(&builder,num);
  pWVar1 = this->world;
  std::__cxx11::string::string<std::allocator<char>>((string *)&builder_1,"GlobalPK",&local_95);
  this_00 = std::__detail::
            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          *)&pWVar1->config,(key_type *)&builder_1);
  bVar3 = util::variant::GetBool(this_00);
  if (bVar3) {
    bVar3 = World::PKExcept(this->world,num);
    std::__cxx11::string::~string((string *)&builder_1);
    if (bVar3) goto LAB_00111859;
    byte = '\x01';
    PacketBuilder::AddByte(&builder,0xff);
  }
  else {
    std::__cxx11::string::~string((string *)&builder_1);
LAB_00111859:
    pMVar4 = World::GetMap(this->world,map);
    PacketBuilder::AddByte(&builder,pMVar4->rid[0]);
    pMVar4 = World::GetMap(this->world,map);
    byte = pMVar4->rid[1];
  }
  PacketBuilder::AddByte(&builder,byte);
  pMVar4 = World::GetMap(this->world,map);
  PacketBuilder::AddByte(&builder,pMVar4->rid[2]);
  pMVar4 = World::GetMap(this->world,map);
  PacketBuilder::AddByte(&builder,pMVar4->rid[3]);
  pMVar4 = World::GetMap(this->world,map);
  PacketBuilder::AddThree(&builder,pMVar4->filesize);
  num_00 = 0;
  PacketBuilder::AddChar(&builder,0);
LAB_00111939:
  PacketBuilder::AddChar(&builder,num_00);
  pMVar4 = this->map;
  if ((pMVar4 != (Map *)0x0) && (pMVar4->exists == true)) {
    Map::Leave(pMVar4,this,animation,false);
  }
  pMVar4 = World::GetMap(this->world,map);
  this->map = pMVar4;
  this->mapid = pMVar4->id;
  this->x = x;
  this->y = (uchar)local_94;
  this->sitting = SIT_STAND;
  this->npc = (NPC *)0x0;
  this->npc_type = NPC;
  this->board = (Board *)0x0;
  this->jukebox_open = false;
  std::__cxx11::string::assign((char *)&this->guild_join);
  std::__cxx11::string::assign((char *)&this->guild_invite);
  if (this->trading == true) {
    PacketBuilder::PacketBuilder(&builder_1,PACKET_TRADE,PACKET_CLOSE,2);
    PacketBuilder::AddShort(&builder_1,this->player->id);
    Send(this->trade_partner,&builder_1);
    this->trading = false;
    std::__cxx11::list<Character_Item,_std::allocator<Character_Item>_>::clear
              (&this->trade_inventory);
    this->trade_agree = false;
    this->trade_partner->trading = false;
    std::__cxx11::list<Character_Item,_std::allocator<Character_Item>_>::clear
              (&this->trade_partner->trade_inventory);
    this->trade_agree = false;
    CheckQuestRules(this);
    CheckQuestRules(this->trade_partner);
    this->trade_partner->trade_partner = (Character *)0x0;
    this->trade_partner = (Character *)0x0;
    PacketBuilder::~PacketBuilder(&builder_1);
  }
  this->warp_anim = animation;
  this->nowhere = false;
  Map::Enter(this->map,this,animation);
  Send(this,&builder);
  pAVar2 = this->arena;
  if (pAVar2 != (Arena *)0x0) {
    pAVar2->occupants = pAVar2->occupants + -1;
    this->arena = (Arena *)0x0;
  }
  pAVar2 = this->next_arena;
  if (pAVar2 != (Arena *)0x0) {
    this->arena = pAVar2;
    pAVar2->occupants = pAVar2->occupants + 1;
    this->next_arena = (Arena *)0x0;
  }
  PacketBuilder::~PacketBuilder(&builder);
  return;
}

Assistant:

void Character::Warp(short map, unsigned char x, unsigned char y, WarpAnimation animation)
{
	if (map <= 0 || map > int(this->world->maps.size()) || !this->world->GetMap(map)->exists)
	{
		return;
	}

	PacketBuilder builder(PACKET_WARP, PACKET_REQUEST);

	if (this->mapid == map && !this->nowhere)
	{
		builder.ReserveMore(5);
		builder.AddChar(WARP_LOCAL);
		builder.AddShort(map);
		builder.AddChar(x);
		builder.AddChar(y);
	}
	else
	{
		builder.ReserveMore(14);
		builder.AddChar(WARP_SWITCH);
		builder.AddShort(map);

		if (this->world->config["GlobalPK"] && !this->world->PKExcept(map))
		{
			builder.AddByte(0xFF);
			builder.AddByte(0x01);
		}
		else
		{
			builder.AddByte(this->world->GetMap(map)->rid[0]);
			builder.AddByte(this->world->GetMap(map)->rid[1]);
		}

		builder.AddByte(this->world->GetMap(map)->rid[2]);
		builder.AddByte(this->world->GetMap(map)->rid[3]);
		builder.AddThree(this->world->GetMap(map)->filesize);
		builder.AddChar(0); // ?
		builder.AddChar(0); // ?
	}

	if (this->map && this->map->exists)
	{
		this->map->Leave(this, animation);
	}

	this->map = this->world->GetMap(map);
	this->mapid = this->map->id;
	this->x = x;
	this->y = y;
	this->sitting = SIT_STAND;

	this->npc = 0;
	this->npc_type = ENF::NPC;
	this->board = 0;
	this->jukebox_open = false;
	this->guild_join = "";
	this->guild_invite = "";

	if (this->trading)
	{
		PacketBuilder builder(PACKET_TRADE, PACKET_CLOSE, 2);
		builder.AddShort(this->PlayerID());
		this->trade_partner->Send(builder);

		this->trading = false;
		this->trade_inventory.clear();
		this->trade_agree = false;

		this->trade_partner->trading = false;
		this->trade_partner->trade_inventory.clear();
		this->trade_agree = false;

		this->CheckQuestRules();
		this->trade_partner->CheckQuestRules();

		this->trade_partner->trade_partner = 0;
		this->trade_partner = 0;
	}

	this->warp_anim = animation;
	this->nowhere = false;

	this->map->Enter(this, animation);

	this->Send(builder);

	if (this->arena)
	{
		--this->arena->occupants;
		this->arena = 0;
	}

	if (this->next_arena)
	{
		this->arena = this->next_arena;
		++this->arena->occupants;
		this->next_arena = 0;
	}
}